

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::XmlReporter::test_case_start_impl(XmlReporter *this,TestCaseData *in)

{
  bool bVar1;
  int iVar2;
  XmlWriter *pXVar3;
  char *pcVar4;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  Approx local_160;
  allocator<char> local_141;
  string local_140;
  uint local_120;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  TestCaseData *pTStack_18;
  bool open_ts_tag;
  TestCaseData *in_local;
  XmlReporter *this_local;
  
  local_19 = 0;
  pTStack_18 = in;
  in_local = (TestCaseData *)this;
  if (this->tc == (TestCaseData *)0x0) {
    local_19 = 1;
  }
  else {
    iVar2 = strcmp(this->tc->m_test_suite,in->m_test_suite);
    if (iVar2 != 0) {
      XmlWriter::endElement(&this->xml);
      local_19 = 1;
    }
  }
  if ((local_19 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"TestSuite",&local_41);
    XmlWriter::startElement(&this->xml,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"name",&local_79);
    XmlWriter::writeAttribute(&this->xml,&local_78,pTStack_18->m_test_suite);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  this->tc = pTStack_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"TestCase",&local_a1);
  pXVar3 = XmlWriter::startElement(&this->xml,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"name",&local_c9);
  pXVar3 = XmlWriter::writeAttribute(pXVar3,&local_c8,pTStack_18->m_name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"filename",&local_f1);
  pcVar4 = String::c_str(&pTStack_18->m_file);
  pcVar4 = skipPathFromFilename(pcVar4);
  pXVar3 = XmlWriter::writeAttribute(pXVar3,&local_f0,pcVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"line",&local_119);
  local_120 = line(this,pTStack_18->m_line);
  pXVar3 = XmlWriter::writeAttribute<unsigned_int>(pXVar3,&local_118,&local_120);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"description",&local_141);
  XmlWriter::writeAttribute(pXVar3,&local_140,pTStack_18->m_description);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  Approx::Approx(&local_160,pTStack_18->m_timeout);
  bVar1 = doctest::operator!=(&local_160,0.0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"timeout",&local_181);
    XmlWriter::writeAttribute<double>(&this->xml,&local_180,&pTStack_18->m_timeout);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
  }
  if ((pTStack_18->m_may_fail & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"may_fail",&local_1a9);
    XmlWriter::writeAttribute(&this->xml,&local_1a8,true);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
  }
  if ((pTStack_18->m_should_fail & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"should_fail",&local_1d1);
    XmlWriter::writeAttribute(&this->xml,&local_1d0,true);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
  }
  return;
}

Assistant:

void test_case_start_impl(const TestCaseData& in) {
            bool open_ts_tag = false;
            if(tc != nullptr) { // we have already opened a test suite
                if(std::strcmp(tc->m_test_suite, in.m_test_suite) != 0) {
                    xml.endElement();
                    open_ts_tag = true;
                }
            }
            else {
                open_ts_tag = true; // first test case ==> first test suite
            }

            if(open_ts_tag) {
                xml.startElement("TestSuite");
                xml.writeAttribute("name", in.m_test_suite);
            }

            tc = &in;
            xml.startElement("TestCase")
                    .writeAttribute("name", in.m_name)
                    .writeAttribute("filename", skipPathFromFilename(in.m_file.c_str()))
                    .writeAttribute("line", line(in.m_line))
                    .writeAttribute("description", in.m_description);

            if(Approx(in.m_timeout) != 0)
                xml.writeAttribute("timeout", in.m_timeout);
            if(in.m_may_fail)
                xml.writeAttribute("may_fail", true);
            if(in.m_should_fail)
                xml.writeAttribute("should_fail", true);
        }